

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_relational_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_arith_expression(this);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar1 = match(this,TK_LT);
          if (!bVar1) break;
          Token::operator=(&oper,(this->matched)._M_current);
          pEVar2 = (Expression *)operator_new(0x68);
          pEVar3 = parse_arith_expression(this);
          LessThanExpression::LessThanExpression((LessThanExpression *)pEVar2,&oper,left,pEVar3);
          left = pEVar2;
        }
        bVar1 = match(this,TK_GT);
        if (!bVar1) break;
        Token::operator=(&oper,(this->matched)._M_current);
        pEVar2 = (Expression *)operator_new(0x68);
        pEVar3 = parse_arith_expression(this);
        GreaterThanExpression::GreaterThanExpression
                  ((GreaterThanExpression *)pEVar2,&oper,left,pEVar3);
        left = pEVar2;
      }
      bVar1 = match(this,TK_LE);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_arith_expression(this);
      LessThanOrEqualExpression::LessThanOrEqualExpression
                ((LessThanOrEqualExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_GE);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_arith_expression(this);
    GreaterThanOrEqualExpression::GreaterThanOrEqualExpression
              ((GreaterThanOrEqualExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression* Parser::parse_relational_expression() {
    Token oper;
    Expression* expression = parse_arith_expression();

    while (true) {
        if (match(TK_LT)) {
            oper = *matched;
            expression = new LessThanExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_GT)) {
            oper = *matched;
            expression = new GreaterThanExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_LE)) {
            oper = *matched;
            expression = new LessThanOrEqualExpression(oper, expression, parse_arith_expression());
        } else if (match(TK_GE)) {
            oper = *matched;
            expression = new GreaterThanOrEqualExpression(oper, expression, parse_arith_expression());
        } else {
            break;
        }
    }

    return expression;
}